

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

_Bool Curl_auth_digest_get_pair(char *str,char *value,char *content,char **endptr)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  int local_34;
  _Bool escape;
  _Bool starts_with_quote;
  int c;
  char **endptr_local;
  char *content_local;
  char *value_local;
  char *str_local;
  
  bVar2 = false;
  local_34 = 0xff;
  content_local = value;
  value_local = str;
  while( true ) {
    bVar5 = false;
    if ((*value_local != '\0') && (bVar5 = false, *value_local != '=')) {
      bVar5 = local_34 != 0;
      local_34 = local_34 + -1;
    }
    if (!bVar5) break;
    *content_local = *value_local;
    content_local = content_local + 1;
    value_local = value_local + 1;
  }
  *content_local = '\0';
  if (*value_local == '=') {
    bVar5 = value_local[1] == '\"';
    pcVar4 = value_local + 1;
    if (bVar5) {
      pcVar4 = value_local + 2;
    }
    value_local = pcVar4;
    local_34 = 0x3ff;
    endptr_local = (char **)content;
    while( true ) {
      iVar3 = local_34;
      if (*value_local != '\0') {
        local_34 = local_34 + -1;
      }
      if (*value_local == '\0' || iVar3 == 0) break;
      cVar1 = *value_local;
      if ((cVar1 == '\n') || (cVar1 == '\r')) {
        local_34 = 0;
      }
      else if (cVar1 == '\"') {
        if ((bVar2) || (!bVar5)) goto LAB_00165f73;
        local_34 = 0;
      }
      else if (cVar1 == ',') {
        if (bVar5) goto LAB_00165f73;
        local_34 = 0;
      }
      else if ((cVar1 != '\\') || (bVar2)) {
LAB_00165f73:
        bVar2 = false;
        *(char *)endptr_local = *value_local;
        endptr_local = (char **)((long)endptr_local + 1);
      }
      else {
        bVar2 = true;
        *(undefined1 *)endptr_local = 0x5c;
        endptr_local = (char **)((long)endptr_local + 1);
      }
      value_local = value_local + 1;
    }
    *(undefined1 *)endptr_local = 0;
    *endptr = value_local;
    str_local._7_1_ = true;
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool Curl_auth_digest_get_pair(const char *str, char *value, char *content,
                               const char **endptr)
{
  int c;
  bool starts_with_quote = FALSE;
  bool escape = FALSE;

  for(c = DIGEST_MAX_VALUE_LENGTH - 1; (*str && (*str != '=') && c--);)
    *value++ = *str++;
  *value = 0;

  if('=' != *str++)
    /* eek, no match */
    return FALSE;

  if('\"' == *str) {
    /* This starts with a quote so it must end with one as well! */
    str++;
    starts_with_quote = TRUE;
  }

  for(c = DIGEST_MAX_CONTENT_LENGTH - 1; *str && c--; str++) {
    switch(*str) {
    case '\\':
      if(!escape) {
        /* possibly the start of an escaped quote */
        escape = TRUE;
        *content++ = '\\'; /* Even though this is an escape character, we still
                              store it as-is in the target buffer */
        continue;
      }
      break;

    case ',':
      if(!starts_with_quote) {
        /* This signals the end of the content if we didn't get a starting
           quote and then we do "sloppy" parsing */
        c = 0; /* the end */
        continue;
      }
      break;

    case '\r':
    case '\n':
      /* end of string */
      c = 0;
      continue;

    case '\"':
      if(!escape && starts_with_quote) {
        /* end of string */
        c = 0;
        continue;
      }
      break;
    }

    escape = FALSE;
    *content++ = *str;
  }

  *content = 0;
  *endptr = str;

  return TRUE;
}